

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addSwizzle<glslang::TMatrixSelector>
          (TIntermediate *this,TSwizzleSelectors<glslang::TMatrixSelector> *selector,TSourceLoc *loc
          )

{
  int iVar1;
  TIntermSequence *sequence;
  int iVar2;
  TIntermAggregate *this_00;
  TMatrixSelector local_3c;
  int local_34;
  TIntermSequence *pTStack_30;
  int i;
  TIntermSequence *sequenceVector;
  TIntermAggregate *node;
  TSourceLoc *loc_local;
  TSwizzleSelectors<glslang::TMatrixSelector> *selector_local;
  TIntermediate *this_local;
  
  node = (TIntermAggregate *)loc;
  loc_local = (TSourceLoc *)selector;
  selector_local = (TSwizzleSelectors<glslang::TMatrixSelector> *)this;
  this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)selector);
  TIntermAggregate::TIntermAggregate(this_00,EOpSequence);
  sequenceVector = (TIntermSequence *)this_00;
  (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
            (this_00,node);
  pTStack_30 = (TIntermSequence *)
               (*(code *)(sequenceVector->
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Tp_alloc_type.allocator[4].alignmentMask)();
  local_34 = 0;
  while( true ) {
    iVar1 = local_34;
    iVar2 = TSwizzleSelectors<glslang::TMatrixSelector>::size
                      ((TSwizzleSelectors<glslang::TMatrixSelector> *)loc_local);
    sequence = pTStack_30;
    if (iVar2 <= iVar1) break;
    local_3c = TSwizzleSelectors<glslang::TMatrixSelector>::operator[]
                         ((TSwizzleSelectors<glslang::TMatrixSelector> *)loc_local,local_34);
    pushSelector(this,sequence,&local_3c,(TSourceLoc *)node);
    local_34 = local_34 + 1;
  }
  return (TIntermTyped *)sequenceVector;
}

Assistant:

TIntermTyped* TIntermediate::addSwizzle(TSwizzleSelectors<selectorType>& selector, const TSourceLoc& loc)
{
    TIntermAggregate* node = new TIntermAggregate(EOpSequence);

    node->setLoc(loc);
    TIntermSequence &sequenceVector = node->getSequence();

    for (int i = 0; i < selector.size(); i++)
        pushSelector(sequenceVector, selector[i], loc);

    return node;
}